

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_mdef.c
# Opt level: O3

bin_mdef_t * bin_mdef_read(ps_config_t *config,char *filename)

{
  ushort *puVar1;
  ushort uVar2;
  char *pcVar3;
  cd_tree_t *pcVar4;
  uint16 *puVar5;
  int16 *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int32 iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  bin_mdef_t *pbVar14;
  FILE *__stream;
  size_t sVar15;
  char **ppcVar16;
  long lVar17;
  char *pcVar18;
  mmio_file_t *pmVar19;
  void *pvVar20;
  int32 *piVar21;
  cd_tree_t *pcVar22;
  long lVar23;
  uint16 **ppuVar24;
  int16 *piVar25;
  uint uVar26;
  int32 *piVar27;
  short sVar28;
  size_t size;
  uint *puVar29;
  ulong uVar30;
  long lVar31;
  mdef_entry_t *pmVar32;
  undefined1 auVar33 [16];
  int iVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  int iVar52;
  int iVar55;
  undefined1 auVar53 [16];
  int iVar56;
  undefined1 auVar54 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar59 [16];
  int32 val;
  int32 *local_60;
  int32 *local_58;
  int32 *local_50;
  mdef_entry_t **local_48;
  int32 *local_40;
  int32 *local_38;
  
  pbVar14 = bin_mdef_read_text(config,filename);
  if (pbVar14 != (bin_mdef_t *)0x0) {
    return pbVar14;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
          ,0x150,"Reading binary model definition: %s\n",filename);
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    return (bin_mdef_t *)0x0;
  }
  sVar15 = fread(&val,4,1,__stream);
  iVar10 = val;
  if (sVar15 != 1) {
    fclose(__stream);
    pcVar18 = "Failed to read byte-order marker from %s\n";
    lVar17 = 0x157;
    goto LAB_00120ead;
  }
  if (val == 0x424d4446) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x15d,"Must byte-swap %s\n",filename);
    sVar15 = fread(&val,4,1,__stream);
    if (sVar15 != 1) {
LAB_00120e90:
      fclose(__stream);
      pcVar18 = "Failed to read version from %s\n";
      lVar17 = 0x161;
      goto LAB_00120ead;
    }
    val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
  }
  else {
    sVar15 = fread(&val,4,1,__stream);
    if (sVar15 != 1) goto LAB_00120e90;
  }
  if (1 < val) {
    pbVar14 = (bin_mdef_t *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
            ,0x168,"File format version %d for %s is newer than library\n",(ulong)(uint)val,filename
           );
    goto LAB_00120e86;
  }
  sVar15 = fread(&val,4,1,__stream);
  if (sVar15 != 1) {
    fclose(__stream);
    pcVar18 = "Failed to read header length from %s\n";
    lVar17 = 0x16e;
LAB_00120ead:
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                   ,lVar17,pcVar18,filename);
    return (bin_mdef_t *)0x0;
  }
  if (iVar10 == 0x424d4446) {
    val = (uint)val >> 0x18 | (val & 0xff0000U) >> 8 | (val & 0xff00U) << 8 | val << 0x18;
  }
  fseek(__stream,(long)val,1);
  pbVar14 = (bin_mdef_t *)
            __ckd_calloc__(1,0x78,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                           ,0x177);
  pbVar14->refcnt = 1;
  sVar15 = fread(&pbVar14->n_ciphone,4,1,__stream);
  if (sVar15 != 1) {
    fclose(__stream);
    ckd_free(pbVar14);
    pcVar18 = "&m->n_ciphone";
    lVar17 = 0x184;
    goto LAB_0012147c;
  }
  if (iVar10 == 0x424d4446) {
    uVar12 = pbVar14->n_ciphone;
    pbVar14->n_ciphone =
         uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
    local_40 = &pbVar14->n_phone;
    sVar15 = fread(local_40,4,1,__stream);
    if (sVar15 == 1) {
      uVar12 = pbVar14->n_phone;
      pbVar14->n_phone =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      local_50 = &pbVar14->n_emit_state;
      sVar15 = fread(local_50,4,1,__stream);
      if (sVar15 != 1) goto LAB_001212ff;
      uVar12 = pbVar14->n_emit_state;
      pbVar14->n_emit_state =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      sVar15 = fread(&pbVar14->n_ci_sen,4,1,__stream);
      if (sVar15 != 1) goto LAB_00121330;
      uVar12 = pbVar14->n_ci_sen;
      pbVar14->n_ci_sen =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      local_58 = &pbVar14->n_sen;
      sVar15 = fread(local_58,4,1,__stream);
      if (sVar15 != 1) goto LAB_00121361;
      uVar12 = pbVar14->n_sen;
      pbVar14->n_sen =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      sVar15 = fread(&pbVar14->n_tmat,4,1,__stream);
      if (sVar15 != 1) goto LAB_00121392;
      uVar12 = pbVar14->n_tmat;
      pbVar14->n_tmat =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      local_38 = &pbVar14->n_sseq;
      sVar15 = fread(local_38,4,1,__stream);
      if (sVar15 != 1) goto LAB_001213c3;
      uVar12 = pbVar14->n_sseq;
      pbVar14->n_sseq =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      sVar15 = fread(&pbVar14->n_ctx,4,1,__stream);
      if (sVar15 != 1) goto LAB_001213f4;
      uVar12 = pbVar14->n_ctx;
      pbVar14->n_ctx =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      sVar15 = fread(&pbVar14->n_cd_tree,4,1,__stream);
      if (sVar15 != 1) goto LAB_00121422;
      uVar12 = pbVar14->n_cd_tree;
      pbVar14->n_cd_tree =
           uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      local_60 = &pbVar14->sil;
      sVar15 = fread(local_60,4,1,__stream);
      if (sVar15 != 1) {
LAB_00121450:
        fclose(__stream);
        ckd_free(pbVar14);
        pcVar18 = "&m->sil";
        lVar17 = 0x18d;
        goto LAB_0012147c;
      }
      uVar12 = *local_60;
      *local_60 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
                  uVar12 << 0x18;
LAB_0012127e:
      ppcVar16 = (char **)__ckd_calloc__((long)pbVar14->n_ciphone,8,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,400);
      pbVar14->ciname = ppcVar16;
      if (config == (ps_config_t *)0x0) {
        if (iVar10 == 0x424d4446) goto LAB_0012149d;
LAB_00121564:
        pmVar19 = mmio_file_read(filename);
        pbVar14->filemap = pmVar19;
        local_60 = (int32 *)ftell(__stream);
        if (pmVar19 == (mmio_file_t *)0x0) goto LAB_001214c9;
        pvVar20 = mmio_file_ptr(pbVar14->filemap);
        *pbVar14->ciname = (char *)((long)pvVar20 + (long)local_60);
        pbVar14->alloc_mode = BIN_MDEF_ON_DISK;
      }
      else {
        iVar11 = ps_config_bool(config,"mmap");
        if (iVar10 == 0x424d4446) {
LAB_0012149d:
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                  ,0x195,"-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
        }
        else if (iVar11 != 0) goto LAB_00121564;
        local_60 = (int32 *)ftell(__stream);
LAB_001214c9:
        pbVar14->alloc_mode = BIN_MDEF_IN_MEMORY;
        fseek(__stream,0,2);
        lVar17 = ftell(__stream);
        fseek(__stream,(long)local_60,0);
        size = lVar17 - (long)local_60;
        pcVar18 = (char *)__ckd_malloc__(size,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                         ,0x1ab);
        *pbVar14->ciname = pcVar18;
        sVar15 = fread(*pbVar14->ciname,1,size,__stream);
        if (sVar15 != size) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                  ,0x1ad,"Failed to read %d bytes of data from %s\n",size,filename);
          exit(1);
        }
      }
      piVar27 = (int32 *)(long)pbVar14->n_ciphone;
      piVar21 = (int32 *)&DAT_00000001;
      if (1 < (long)piVar27) {
        puVar29 = (uint *)&DAT_00000001;
        local_60 = piVar27;
        do {
          ppcVar16 = pbVar14->ciname;
          pcVar18 = ppcVar16[(long)((long)puVar29 + -1)];
          sVar15 = strlen(pcVar18);
          ppcVar16[(long)puVar29] = pcVar18 + sVar15 + 1;
          puVar29 = (uint *)((long)puVar29 + 1);
          piVar21 = local_60;
        } while ((uint *)local_60 != puVar29);
      }
      ppcVar16 = pbVar14->ciname;
      pcVar18 = ppcVar16[(long)((long)piVar21 + -1)];
      sVar15 = strlen(pcVar18);
      pcVar3 = *ppcVar16;
      pcVar22 = (cd_tree_t *)
                (pcVar3 + ((ulong)(pcVar18 + (sVar15 - (long)pcVar3) + 4) & 0xfffffffffffffffc));
      pbVar14->cd_tree = pcVar22;
      lVar17 = (long)pbVar14->n_cd_tree;
      if (iVar10 == 0x424d4446) {
        if (0 < pbVar14->n_cd_tree) {
          lVar23 = 0;
          do {
            pcVar4 = pbVar14->cd_tree;
            pcVar22 = pcVar4 + lVar23;
            pcVar22->ctx = pcVar22->ctx << 8 | (ushort)pcVar22->ctx >> 8;
            piVar25 = &pcVar4[lVar23].n_down;
            *piVar25 = *piVar25 << 8 | (ushort)*piVar25 >> 8;
            uVar12 = pcVar4[lVar23].c.pid;
            pcVar4[lVar23].c.pid =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
            lVar23 = lVar23 + 1;
            lVar17 = (long)pbVar14->n_cd_tree;
          } while (lVar23 < lVar17);
          pcVar22 = pbVar14->cd_tree;
        }
        pbVar14->phone = (mdef_entry_t *)(pcVar22 + lVar17);
        lVar23 = (long)pbVar14->n_phone;
        if (0 < lVar23) {
          lVar31 = 0;
          do {
            uVar12 = *(uint *)((long)&pcVar22[lVar17].ctx + lVar31);
            uVar26 = *(uint *)((long)&pcVar22[lVar17].c + lVar31);
            *(uint *)((long)&pcVar22[lVar17].ctx + lVar31) =
                 uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18
            ;
            *(uint *)((long)&pcVar22[lVar17].c + lVar31) =
                 uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 | (uVar26 & 0xff00) << 8 | uVar26 << 0x18
            ;
            lVar31 = lVar31 + 0xc;
          } while (lVar23 * 0xc != lVar31);
        }
        pmVar32 = (mdef_entry_t *)(pcVar22 + lVar17) + lVar23;
        uVar12 = pmVar32->ssid;
        pmVar32->ssid =
             uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      }
      else {
        pbVar14->phone = (mdef_entry_t *)(pcVar22 + lVar17);
        pmVar32 = (mdef_entry_t *)(pcVar22 + lVar17) + pbVar14->n_phone;
      }
      local_48 = &pbVar14->phone;
      ppuVar24 = (uint16 **)
                 __ckd_calloc__((long)pbVar14->n_sseq,8,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                ,0x1c9);
      pbVar14->sseq = ppuVar24;
      *ppuVar24 = (uint16 *)&pmVar32->tmat;
      if ((iVar10 == 0x424d4446) && (iVar11 = pmVar32->ssid, 0 < (long)iVar11)) {
        puVar5 = *pbVar14->sseq;
        lVar17 = 0;
        do {
          puVar1 = puVar5 + lVar17;
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar17 = lVar17 + 1;
        } while (iVar11 != lVar17);
      }
      if ((long)*local_50 == 0) {
        pbVar14->sseq_len = (uint8 *)(*pbVar14->sseq + pmVar32->ssid);
        iVar11 = pbVar14->n_sseq;
        if (1 < (long)iVar11) {
          lVar17 = 0;
          do {
            pbVar14->sseq[lVar17 + 1] =
                 (uint16 *)
                 ((ulong)((uint)pbVar14->sseq_len[lVar17] * 2) + (long)pbVar14->sseq[lVar17]);
            lVar17 = lVar17 + 1;
          } while ((long)iVar11 + -1 != lVar17);
        }
      }
      else {
        iVar11 = *local_38;
        if (1 < (long)iVar11) {
          lVar17 = (long)*local_50 * 2;
          lVar31 = 1;
          lVar23 = lVar17;
          do {
            pbVar14->sseq[lVar31] = (uint16 *)((long)*pbVar14->sseq + lVar23);
            lVar31 = lVar31 + 1;
            lVar23 = lVar23 + lVar17;
          } while (iVar11 != lVar31);
        }
      }
      piVar25 = (int16 *)__ckd_malloc__((long)pbVar14->n_sen * 2,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                        ,0x1dd);
      pbVar14->cd2cisen = piVar25;
      piVar25 = (int16 *)__ckd_malloc__((long)pbVar14->n_sen * 2,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                                        ,0x1de);
      pbVar14->sen2cimap = piVar25;
      auVar9 = _DAT_00152bb0;
      uVar12 = pbVar14->n_ci_sen;
      if ((long)(int)uVar12 < 1) {
        uVar12 = 0;
      }
      else {
        piVar6 = pbVar14->cd2cisen;
        lVar17 = (long)(int)uVar12 + -1;
        auVar33._8_4_ = (int)lVar17;
        auVar33._0_8_ = lVar17;
        auVar33._12_4_ = (int)((ulong)lVar17 >> 0x20);
        uVar30 = 0;
        auVar33 = auVar33 ^ _DAT_00152bb0;
        auVar35 = _DAT_00153aa0;
        auVar36 = _DAT_00153ab0;
        auVar37 = _DAT_00153ac0;
        auVar38 = _DAT_00152ba0;
        do {
          auVar39 = auVar38 ^ auVar9;
          iVar11 = auVar33._0_4_;
          iVar52 = -(uint)(iVar11 < auVar39._0_4_);
          iVar13 = auVar33._4_4_;
          auVar40._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
          iVar56 = auVar33._8_4_;
          iVar55 = -(uint)(iVar56 < auVar39._8_4_);
          iVar34 = auVar33._12_4_;
          auVar40._12_4_ = -(uint)(iVar34 < auVar39._12_4_);
          auVar49._4_4_ = iVar52;
          auVar49._0_4_ = iVar52;
          auVar49._8_4_ = iVar55;
          auVar49._12_4_ = iVar55;
          auVar57 = pshuflw(in_XMM11,auVar49,0xe8);
          auVar42._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
          auVar42._12_4_ = -(uint)(auVar39._12_4_ == iVar34);
          auVar42._0_4_ = auVar42._4_4_;
          auVar42._8_4_ = auVar42._12_4_;
          auVar59 = pshuflw(in_XMM12,auVar42,0xe8);
          auVar40._0_4_ = auVar40._4_4_;
          auVar40._8_4_ = auVar40._12_4_;
          auVar58 = pshuflw(auVar57,auVar40,0xe8);
          auVar39._8_4_ = 0xffffffff;
          auVar39._0_8_ = 0xffffffffffffffff;
          auVar39._12_4_ = 0xffffffff;
          auVar39 = (auVar58 | auVar59 & auVar57) ^ auVar39;
          auVar39 = packssdw(auVar39,auVar39);
          sVar28 = (short)uVar30;
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            piVar6[uVar30] = sVar28;
          }
          auVar40 = auVar42 & auVar49 | auVar40;
          auVar39 = packssdw(auVar40,auVar40);
          auVar58._8_4_ = 0xffffffff;
          auVar58._0_8_ = 0xffffffffffffffff;
          auVar58._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar58,auVar39 ^ auVar58);
          if ((auVar39._0_4_ >> 0x10 & 1) != 0) {
            piVar6[uVar30 + 1] = sVar28 + 1;
          }
          auVar39 = auVar37 ^ auVar9;
          iVar52 = -(uint)(iVar11 < auVar39._0_4_);
          auVar53._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
          iVar55 = -(uint)(iVar56 < auVar39._8_4_);
          auVar53._12_4_ = -(uint)(iVar34 < auVar39._12_4_);
          auVar41._4_4_ = iVar52;
          auVar41._0_4_ = iVar52;
          auVar41._8_4_ = iVar55;
          auVar41._12_4_ = iVar55;
          auVar48._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
          auVar48._12_4_ = -(uint)(auVar39._12_4_ == iVar34);
          auVar48._0_4_ = auVar48._4_4_;
          auVar48._8_4_ = auVar48._12_4_;
          auVar53._0_4_ = auVar53._4_4_;
          auVar53._8_4_ = auVar53._12_4_;
          auVar39 = auVar48 & auVar41 | auVar53;
          auVar39 = packssdw(auVar39,auVar39);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar7,auVar39 ^ auVar7);
          if ((auVar39 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 2] = sVar28 + 2;
          }
          auVar42 = pshufhw(auVar41,auVar41,0x84);
          auVar49 = pshufhw(auVar48,auVar48,0x84);
          auVar40 = pshufhw(auVar42,auVar53,0x84);
          auVar43._8_4_ = 0xffffffff;
          auVar43._0_8_ = 0xffffffffffffffff;
          auVar43._12_4_ = 0xffffffff;
          auVar43 = (auVar40 | auVar49 & auVar42) ^ auVar43;
          auVar42 = packssdw(auVar43,auVar43);
          if ((auVar42 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 3] = sVar28 + 3;
          }
          auVar42 = auVar36 ^ auVar9;
          iVar52 = -(uint)(iVar11 < auVar42._0_4_);
          auVar45._4_4_ = -(uint)(iVar13 < auVar42._4_4_);
          iVar55 = -(uint)(iVar56 < auVar42._8_4_);
          auVar45._12_4_ = -(uint)(iVar34 < auVar42._12_4_);
          auVar50._4_4_ = iVar52;
          auVar50._0_4_ = iVar52;
          auVar50._8_4_ = iVar55;
          auVar50._12_4_ = iVar55;
          auVar39 = pshuflw(auVar39,auVar50,0xe8);
          auVar44._4_4_ = -(uint)(auVar42._4_4_ == iVar13);
          auVar44._12_4_ = -(uint)(auVar42._12_4_ == iVar34);
          auVar44._0_4_ = auVar44._4_4_;
          auVar44._8_4_ = auVar44._12_4_;
          in_XMM12 = pshuflw(auVar59 & auVar57,auVar44,0xe8);
          in_XMM12 = in_XMM12 & auVar39;
          auVar45._0_4_ = auVar45._4_4_;
          auVar45._8_4_ = auVar45._12_4_;
          auVar39 = pshuflw(auVar39,auVar45,0xe8);
          auVar57._8_4_ = 0xffffffff;
          auVar57._0_8_ = 0xffffffffffffffff;
          auVar57._12_4_ = 0xffffffff;
          auVar57 = (auVar39 | in_XMM12) ^ auVar57;
          auVar39 = packssdw(auVar57,auVar57);
          if ((auVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 4] = sVar28 + 4;
          }
          auVar45 = auVar44 & auVar50 | auVar45;
          auVar39 = packssdw(auVar45,auVar45);
          auVar59._8_4_ = 0xffffffff;
          auVar59._0_8_ = 0xffffffffffffffff;
          auVar59._12_4_ = 0xffffffff;
          auVar39 = packssdw(auVar39 ^ auVar59,auVar39 ^ auVar59);
          if ((auVar39 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 5] = sVar28 + 5;
          }
          auVar39 = auVar35 ^ auVar9;
          iVar11 = -(uint)(iVar11 < auVar39._0_4_);
          auVar54._4_4_ = -(uint)(iVar13 < auVar39._4_4_);
          iVar56 = -(uint)(iVar56 < auVar39._8_4_);
          auVar54._12_4_ = -(uint)(iVar34 < auVar39._12_4_);
          auVar46._4_4_ = iVar11;
          auVar46._0_4_ = iVar11;
          auVar46._8_4_ = iVar56;
          auVar46._12_4_ = iVar56;
          auVar51._4_4_ = -(uint)(auVar39._4_4_ == iVar13);
          auVar51._12_4_ = -(uint)(auVar39._12_4_ == iVar34);
          auVar51._0_4_ = auVar51._4_4_;
          auVar51._8_4_ = auVar51._12_4_;
          auVar54._0_4_ = auVar54._4_4_;
          auVar54._8_4_ = auVar54._12_4_;
          auVar39 = auVar51 & auVar46 | auVar54;
          auVar39 = packssdw(auVar39,auVar39);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          in_XMM11 = packssdw(auVar39 ^ auVar8,auVar39 ^ auVar8);
          if ((in_XMM11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 6] = sVar28 + 6;
          }
          auVar39 = pshufhw(auVar46,auVar46,0x84);
          auVar40 = pshufhw(auVar51,auVar51,0x84);
          auVar42 = pshufhw(auVar39,auVar54,0x84);
          auVar47._8_4_ = 0xffffffff;
          auVar47._0_8_ = 0xffffffffffffffff;
          auVar47._12_4_ = 0xffffffff;
          auVar47 = (auVar42 | auVar40 & auVar39) ^ auVar47;
          auVar39 = packssdw(auVar47,auVar47);
          if ((auVar39 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            piVar6[uVar30 + 7] = sVar28 + 7;
          }
          uVar30 = uVar30 + 8;
          lVar17 = auVar38._8_8_;
          auVar38._0_8_ = auVar38._0_8_ + 8;
          auVar38._8_8_ = lVar17 + 8;
          lVar17 = auVar37._8_8_;
          auVar37._0_8_ = auVar37._0_8_ + 8;
          auVar37._8_8_ = lVar17 + 8;
          lVar17 = auVar36._8_8_;
          auVar36._0_8_ = auVar36._0_8_ + 8;
          auVar36._8_8_ = lVar17 + 8;
          lVar17 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 8;
          auVar35._8_8_ = lVar17 + 8;
        } while ((uVar12 + 7 & 0xfffffff8) != uVar30);
      }
      uVar26 = *local_58;
      if ((int)uVar12 < (int)uVar26) {
        memset((void *)((ulong)(uVar12 * 2) + (long)pbVar14->cd2cisen),0xff,
               (ulong)(~uVar12 + uVar26) * 2 + 2);
      }
      if (0 < (int)uVar26) {
        memset(piVar25,0xff,(ulong)uVar26 * 2);
      }
      iVar11 = *local_40;
      if (0 < iVar11) {
        uVar30 = 0;
        do {
          local_60 = (int32 *)(uVar30 * 3);
          local_58 = (int32 *)(long)(*local_48)[uVar30].ssid;
          lVar17 = 0;
          while( true ) {
            uVar12 = *local_50;
            uVar26 = uVar12;
            if (uVar12 == 0) {
              uVar26 = (uint)pbVar14->sseq_len[(&pbVar14->phone->ssid)[(long)local_60]];
            }
            if ((int)uVar26 <= lVar17) break;
            uVar26 = (uint)uVar30;
            if ((long)pbVar14->n_ciphone <= (long)uVar30) {
              uVar26 = (uint)*(byte *)((long)&(*local_48)->info + (long)local_60 * 4 + 1);
            }
            uVar2 = pbVar14->sseq[(long)local_58][lVar17];
            sVar28 = pbVar14->sen2cimap[uVar2];
            if (sVar28 == -1) {
              sVar28 = (short)uVar26;
              pbVar14->sen2cimap[uVar2] = sVar28;
            }
            if (uVar26 != (int)sVar28) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                      ,499,"Senone %d is shared between multiple base phones\n");
              uVar12 = *local_50;
            }
            if (uVar12 == 0) {
              uVar12 = (uint)pbVar14->sseq_len[pbVar14->phone[uVar26].ssid];
            }
            if ((int)uVar12 < lVar17) {
              err_msg(ERR_WARN,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                      ,0x1f7,"CD phone %d has fewer states than CI phone %d\n",uVar30 & 0xffffffff,
                      (ulong)uVar26);
            }
            else {
              pbVar14->cd2cisen[uVar2] = pbVar14->sseq[pbVar14->phone[uVar26].ssid][lVar17];
            }
            lVar17 = lVar17 + 1;
          }
          uVar30 = uVar30 + 1;
          iVar11 = *local_40;
        } while ((long)uVar30 < (long)iVar11);
      }
      iVar13 = bin_mdef_ciphone_id(pbVar14,"SIL");
      pbVar14->sil = iVar13;
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
              ,0x204,"%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n"
              ,(ulong)(uint)pbVar14->n_ciphone,(ulong)(uint)(iVar11 - pbVar14->n_ciphone),
              (ulong)(uint)pbVar14->n_emit_state,(ulong)(uint)pbVar14->n_ci_sen,
              (ulong)(uint)pbVar14->n_sen,(ulong)(uint)pbVar14->n_sseq);
LAB_00120e86:
      fclose(__stream);
      return pbVar14;
    }
  }
  else {
    local_40 = &pbVar14->n_phone;
    sVar15 = fread(local_40,4,1,__stream);
    if (sVar15 == 1) {
      local_50 = &pbVar14->n_emit_state;
      sVar15 = fread(local_50,4,1,__stream);
      if (sVar15 == 1) {
        sVar15 = fread(&pbVar14->n_ci_sen,4,1,__stream);
        if (sVar15 == 1) {
          local_58 = &pbVar14->n_sen;
          sVar15 = fread(local_58,4,1,__stream);
          if (sVar15 == 1) {
            sVar15 = fread(&pbVar14->n_tmat,4,1,__stream);
            if (sVar15 == 1) {
              local_38 = &pbVar14->n_sseq;
              sVar15 = fread(local_38,4,1,__stream);
              if (sVar15 == 1) {
                sVar15 = fread(&pbVar14->n_ctx,4,1,__stream);
                if (sVar15 == 1) {
                  sVar15 = fread(&pbVar14->n_cd_tree,4,1,__stream);
                  if (sVar15 == 1) {
                    sVar15 = fread(&pbVar14->sil,4,1,__stream);
                    if (sVar15 != 1) goto LAB_00121450;
                    goto LAB_0012127e;
                  }
LAB_00121422:
                  fclose(__stream);
                  ckd_free(pbVar14);
                  pcVar18 = "&m->n_cd_tree";
                  lVar17 = 0x18c;
                  goto LAB_0012147c;
                }
LAB_001213f4:
                fclose(__stream);
                ckd_free(pbVar14);
                pcVar18 = "&m->n_ctx";
                lVar17 = 0x18b;
                goto LAB_0012147c;
              }
LAB_001213c3:
              fclose(__stream);
              ckd_free(pbVar14);
              pcVar18 = "&m->n_sseq";
              lVar17 = 0x18a;
              goto LAB_0012147c;
            }
LAB_00121392:
            fclose(__stream);
            ckd_free(pbVar14);
            pcVar18 = "&m->n_tmat";
            lVar17 = 0x189;
            goto LAB_0012147c;
          }
LAB_00121361:
          fclose(__stream);
          ckd_free(pbVar14);
          pcVar18 = "&m->n_sen";
          lVar17 = 0x188;
          goto LAB_0012147c;
        }
LAB_00121330:
        fclose(__stream);
        ckd_free(pbVar14);
        pcVar18 = "&m->n_ci_sen";
        lVar17 = 0x187;
        goto LAB_0012147c;
      }
LAB_001212ff:
      fclose(__stream);
      ckd_free(pbVar14);
      pcVar18 = "&m->n_emit_state";
      lVar17 = 0x186;
      goto LAB_0012147c;
    }
  }
  fclose(__stream);
  ckd_free(pbVar14);
  pcVar18 = "&m->n_phone";
  lVar17 = 0x185;
LAB_0012147c:
  err_msg_system(ERR_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/bin_mdef.c"
                 ,lVar17,"Failed to read %s from %s\n",pcVar18,filename);
  return (bin_mdef_t *)0x0;
}

Assistant:

bin_mdef_t *
bin_mdef_read(ps_config_t *config, const char *filename)
{
    bin_mdef_t *m;
    FILE *fh;
    size_t tree_start;
    int32 val, i, do_mmap, swap;
    long pos, end;
    int32 *sseq_size;

    /* Try to read it as text first. */
    if ((m = bin_mdef_read_text(config, filename)) != NULL)
        return m;

    E_INFO("Reading binary model definition: %s\n", filename);
    if ((fh = fopen(filename, "rb")) == NULL)
        return NULL;

    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read byte-order marker from %s\n",
                       filename);
        return NULL;
    }
    swap = 0;
    if (val == BIN_MDEF_OTHER_ENDIAN) {
        swap = 1;
        E_INFO("Must byte-swap %s\n", filename);
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read version from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    if (val > BIN_MDEF_FORMAT_VERSION) {
        E_ERROR("File format version %d for %s is newer than library\n",
                val, filename);
        fclose(fh);
        return NULL;
    }
    if (fread(&val, 4, 1, fh) != 1) {
        fclose(fh);
        E_ERROR_SYSTEM("Failed to read header length from %s\n", filename);
        return NULL;
    }
    if (swap)
        SWAP_INT32(&val);
    /* Skip format descriptor. */
    fseek(fh, val, SEEK_CUR);

    /* Finally allocate it. */
    m = ckd_calloc(1, sizeof(*m));
    m->refcnt = 1;

    /* Check these, to make gcc/glibc shut up. */
#define FREAD_SWAP32_CHK(dest)                                          \
    if (fread((dest), 4, 1, fh) != 1) {                                 \
        fclose(fh);                                                     \
        ckd_free(m);                                                    \
        E_ERROR_SYSTEM("Failed to read %s from %s\n", #dest, filename); \
        return NULL;                                                    \
    }                                                                   \
    if (swap) SWAP_INT32(dest);
    
    FREAD_SWAP32_CHK(&m->n_ciphone);
    FREAD_SWAP32_CHK(&m->n_phone);
    FREAD_SWAP32_CHK(&m->n_emit_state);
    FREAD_SWAP32_CHK(&m->n_ci_sen);
    FREAD_SWAP32_CHK(&m->n_sen);
    FREAD_SWAP32_CHK(&m->n_tmat);
    FREAD_SWAP32_CHK(&m->n_sseq);
    FREAD_SWAP32_CHK(&m->n_ctx);
    FREAD_SWAP32_CHK(&m->n_cd_tree);
    FREAD_SWAP32_CHK(&m->sil);

    /* CI names are first in the file. */
    m->ciname = ckd_calloc(m->n_ciphone, sizeof(*m->ciname));

    /* Decide whether to read in the whole file or mmap it. */
    do_mmap = config ? ps_config_bool(config, "mmap") : TRUE;
    if (swap) {
        E_WARN("-mmap specified, but mdef is other-endian.  Will not memory-map.\n");
        do_mmap = FALSE;
    } 
    /* Actually try to mmap it. */
    if (do_mmap) {
        m->filemap = mmio_file_read(filename);
        if (m->filemap == NULL)
            do_mmap = FALSE;
    }
    pos = ftell(fh);
    if (do_mmap) {
        /* Get the base pointer from the memory map. */
        m->ciname[0] = (char *)mmio_file_ptr(m->filemap) + pos;
        /* Success! */
        m->alloc_mode = BIN_MDEF_ON_DISK;
    }
    else {
        /* Read everything into memory. */
        m->alloc_mode = BIN_MDEF_IN_MEMORY;
        fseek(fh, 0, SEEK_END);
        end = ftell(fh);
        fseek(fh, pos, SEEK_SET);
        m->ciname[0] = ckd_malloc(end - pos);
        if (fread(m->ciname[0], 1, end - pos, fh) != (size_t)(end - pos))
            E_FATAL("Failed to read %d bytes of data from %s\n", end - pos, filename);
    }

    for (i = 1; i < m->n_ciphone; ++i)
        m->ciname[i] = m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1;

    /* Skip past the padding. */
    tree_start =
        m->ciname[i - 1] + strlen(m->ciname[i - 1]) + 1 - m->ciname[0];
    tree_start = (tree_start + 3) & ~3;
    m->cd_tree = (cd_tree_t *) (m->ciname[0] + tree_start);
    if (swap) {
        for (i = 0; i < m->n_cd_tree; ++i) {
            SWAP_INT16(&m->cd_tree[i].ctx);
            SWAP_INT16(&m->cd_tree[i].n_down);
            SWAP_INT32(&m->cd_tree[i].c.down);
        }
    }
    m->phone = (mdef_entry_t *) (m->cd_tree + m->n_cd_tree);
    if (swap) {
        for (i = 0; i < m->n_phone; ++i) {
            SWAP_INT32(&m->phone[i].ssid);
            SWAP_INT32(&m->phone[i].tmat);
        }
    }
    sseq_size = (int32 *) (m->phone + m->n_phone);
    if (swap)
        SWAP_INT32(sseq_size);
    m->sseq = ckd_calloc(m->n_sseq, sizeof(*m->sseq));
    m->sseq[0] = (uint16 *) (sseq_size + 1);
    if (swap) {
        for (i = 0; i < *sseq_size; ++i)
            SWAP_INT16(m->sseq[0] + i);
    }
    if (m->n_emit_state) {
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[0] + i * m->n_emit_state;
    }
    else {
        m->sseq_len = (uint8 *) (m->sseq[0] + *sseq_size);
        for (i = 1; i < m->n_sseq; ++i)
            m->sseq[i] = m->sseq[i - 1] + m->sseq_len[i - 1];
    }

    /* Now build the CD-to-CI mappings using the senone sequences.
     * This is the only really accurate way to do it, though it is
     * still inaccurate in the case of heterogeneous topologies or
     * cross-state tying. */
    m->cd2cisen = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->cd2cisen));
    m->sen2cimap = (int16 *) ckd_malloc(m->n_sen * sizeof(*m->sen2cimap));

    /* Default mappings (identity, none) */
    for (i = 0; i < m->n_ci_sen; ++i)
        m->cd2cisen[i] = i;
    for (; i < m->n_sen; ++i)
        m->cd2cisen[i] = -1;
    for (i = 0; i < m->n_sen; ++i)
        m->sen2cimap[i] = -1;
    for (i = 0; i < m->n_phone; ++i) {
        int32 j, ssid = m->phone[i].ssid;

        for (j = 0; j < bin_mdef_n_emit_state_phone(m, i); ++j) {
            int s = bin_mdef_sseq2sen(m, ssid, j);
            int ci = bin_mdef_pid2ci(m, i);
            /* Take the first one and warn if we have cross-state tying. */
            if (m->sen2cimap[s] == -1)
                m->sen2cimap[s] = ci;
            if (m->sen2cimap[s] != ci)
                E_WARN
                    ("Senone %d is shared between multiple base phones\n",
                     s);

            if (j > bin_mdef_n_emit_state_phone(m, ci))
                E_WARN("CD phone %d has fewer states than CI phone %d\n",
                       i, ci);
            else
                m->cd2cisen[s] =
                    bin_mdef_sseq2sen(m, m->phone[ci].ssid, j);
        }
    }

    /* Set the silence phone. */
    m->sil = bin_mdef_ciphone_id(m, S3_SILENCE_CIPHONE);

    E_INFO
        ("%d CI-phone, %d CD-phone, %d emitstate/phone, %d CI-sen, %d Sen, %d Sen-Seq\n",
         m->n_ciphone, m->n_phone - m->n_ciphone, m->n_emit_state,
         m->n_ci_sen, m->n_sen, m->n_sseq);
    fclose(fh);
    return m;
}